

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::lowerCase(SimpleString *this)

{
  char cVar1;
  size_t sVar2;
  size_t extraout_RDX;
  undefined8 extraout_RDX_00;
  size_t sVar3;
  SimpleString *in_RDI;
  SimpleString SVar4;
  size_t i;
  size_t str_size;
  SimpleString *str;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  SimpleString *pSVar5;
  ulong local_38;
  
  pSVar5 = in_RDI;
  SimpleString(in_RDI,(SimpleString *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8))
  ;
  sVar2 = size((SimpleString *)0x176244);
  sVar3 = extraout_RDX;
  for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
    getBuffer(in_RDI);
    cVar1 = ToLower('\0');
    sVar3 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),cVar1);
    in_RDI->buffer_[local_38] = cVar1;
  }
  SVar4.bufferSize_ = sVar3;
  SVar4.buffer_ = (char *)pSVar5;
  return SVar4;
}

Assistant:

SimpleString SimpleString::lowerCase() const
{
    SimpleString str(*this);

    size_t str_size = str.size();
    for (size_t i = 0; i < str_size; i++)
        str.buffer_[i] = ToLower(str.getBuffer()[i]);

    return str;
}